

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void sel_move_selective_undo_proc(Am_Object *command_obj)

{
  Am_Value local_48 [2];
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  Am_Value::Am_Value(&local_28,&Am_No_Value);
  Am_Value::Am_Value(local_48,&Am_No_Value);
  sel_move_grow_general_undo_redo(&local_18,true,true,false,&local_28,local_48);
  Am_Value::~Am_Value(local_48);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, sel_move_selective_undo,
                 (Am_Object command_obj))
{
  sel_move_grow_general_undo_redo(command_obj, true, true, false);
}